

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

void __thiscall
Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::pushRead
          (Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *this,
          unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
          *v)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->m_);
  if (this->closed_ == false) {
    std::
    deque<std::unique_ptr<std::vector<std::complex<float>,std::allocator<std::complex<float>>>,std::default_delete<std::vector<std::complex<float>,std::allocator<std::complex<float>>>>>,std::allocator<std::unique_ptr<std::vector<std::complex<float>,std::allocator<std::complex<float>>>,std::default_delete<std::vector<std::complex<float>,std::allocator<std::complex<float>>>>>>>
    ::
    emplace_back<std::unique_ptr<std::vector<std::complex<float>,std::allocator<std::complex<float>>>,std::default_delete<std::vector<std::complex<float>,std::allocator<std::complex<float>>>>>>
              ((deque<std::unique_ptr<std::vector<std::complex<float>,std::allocator<std::complex<float>>>,std::default_delete<std::vector<std::complex<float>,std::allocator<std::complex<float>>>>>,std::allocator<std::unique_ptr<std::vector<std::complex<float>,std::allocator<std::complex<float>>>,std::default_delete<std::vector<std::complex<float>,std::allocator<std::complex<float>>>>>>>
                *)&this->write_,v);
    std::condition_variable::notify_one();
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void pushRead(std::unique_ptr<T> v) {
    std::unique_lock<std::mutex> lock(m_);
    if (!closed_) {
      write_.push_back(std::move(v));
      cv_.notify_one();
    }
  }